

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void __thiscall duckdb::Pipeline::Schedule(Pipeline *this,shared_ptr<duckdb::Event,_true> *event)

{
  bool bVar1;
  
  Reset(this);
  bVar1 = ScheduleParallel(this,event);
  if (bVar1) {
    return;
  }
  ScheduleSequentialTask(this,event);
  return;
}

Assistant:

void Pipeline::Schedule(shared_ptr<Event> &event) {
	D_ASSERT(ready);
	D_ASSERT(sink);
	Reset();
	if (!ScheduleParallel(event)) {
		// could not parallelize this pipeline: push a sequential task instead
		ScheduleSequentialTask(event);
	}
}